

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  size_t size;
  char cVar1;
  char_t cVar2;
  xpath_value_type xVar3;
  xpath_memory_block *pxVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 __s;
  xpath_stack *pxVar7;
  bool bVar8;
  int iVar9;
  xml_node_struct *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_allocator *pxVar12;
  xpath_node *pxVar13;
  undefined1 *puVar14;
  ulong uVar15;
  bool *pbVar16;
  xpath_allocator *pxVar17;
  byte *pbVar18;
  size_t sVar19;
  long lVar20;
  char_t *pcVar21;
  xml_attribute xVar22;
  char *pcVar23;
  bool **ppbVar24;
  byte *pbVar25;
  uint uVar26;
  char_t *pcVar27;
  byte bVar28;
  undefined1 *puVar29;
  byte *pbVar30;
  byte *pbVar31;
  long lVar32;
  bool *pbVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  xml_node xVar38;
  undefined1 auVar39 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  xpath_node xVar40;
  double v;
  xpath_allocator_capture local_c8;
  undefined1 local_a8 [16];
  xpath_node *local_98;
  xpath_allocator *local_88;
  anon_union_8_5_7bd254c6_for__data *local_80;
  undefined1 local_78 [16];
  ulong local_68;
  undefined1 local_60 [16];
  size_t local_50;
  xpath_stack *local_48;
  xpath_stack local_40;
  
  auVar37 = in_ZMM3._0_16_;
  auVar39 = in_ZMM2._0_16_;
LAB_001263ce:
  switch(this->_type) {
  case '\x12':
    goto switchD_001263e6_caseD_12;
  default:
    goto switchD_001263e6_caseD_13;
  case '\x14':
    xVar3 = ((this->_data).variable)->_type;
    if (xVar3 != (byte)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2a3b,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == 3) {
      if (xVar3 == xpath_type_string) {
        pcVar27 = *(char_t **)((this->_data).variable + 1);
      }
      else {
        pcVar27 = (char_t *)0x0;
      }
      pcVar21 = "";
      if (pcVar27 != (char_t *)0x0) {
        pcVar21 = pcVar27;
      }
      __return_storage_ptr__->_buffer = pcVar21;
      goto LAB_00126f1b;
    }
switchD_001263e6_caseD_13:
    cVar1 = this->_rettype;
    if (cVar1 == '\x01') {
      local_c8._target = stack->temp;
      local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
      local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
      local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
      local_60._8_8_ = (xml_attribute_struct *)stack->result;
      local_60._0_8_ = local_c8._target;
      eval_node_set((xpath_node_set_raw *)local_a8,this,c,(xpath_stack *)local_60,nodeset_eval_first
                   );
      if ((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]) == local_98) goto LAB_00126e73;
      local_78 = (undefined1  [16])
                 xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),local_98,
                             local_a8._0_4_);
      string_value(__return_storage_ptr__,(xpath_node *)local_78,stack->result);
      goto LAB_00126ed4;
    }
    if (cVar1 != '\x02') {
      if (cVar1 != '\x04') {
        __assert_fail("false && \"Wrong expression for return type string\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2a57,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar8 = eval_boolean(this,c,stack);
      pcVar23 = "false";
      if (bVar8) {
        pcVar23 = "true";
      }
      __return_storage_ptr__->_buffer = (char_t *)pcVar23;
      goto LAB_00126f1b;
    }
    local_80 = (anon_union_8_5_7bd254c6_for__data *)__return_storage_ptr__;
    local_c8._target = (xpath_allocator *)eval_number(this,c,stack);
    pxVar12 = stack->result;
    if (((double)local_c8._target != 0.0) || (NAN((double)local_c8._target))) {
      if (NAN((double)local_c8._target)) {
        pcVar23 = "NaN";
      }
      else if (((double)local_c8._target + (double)local_c8._target != (double)local_c8._target) ||
              (NAN((double)local_c8._target + (double)local_c8._target) ||
               NAN((double)local_c8._target))) {
        pcVar23 = (char *)0x0;
      }
      else {
        pcVar23 = "-Infinity";
        if (0.0 < (double)local_c8._target) {
          pcVar23 = "Infinity";
        }
      }
    }
    else {
      pcVar23 = "0";
    }
    __return_storage_ptr__ = (xpath_string *)local_80;
    if ((char_t *)pcVar23 != (char_t *)0x0) goto LAB_00126f18;
    local_88 = local_c8._target;
    snprintf((char *)&local_c8,0x20,"%.*e",0xf);
    pbVar18 = (byte *)strchr((char *)&local_c8,0x65);
    if (pbVar18 == (byte *)0x0) {
      __assert_fail("exponent_string",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2037,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    iVar9 = atoi((char *)(pbVar18 + 1));
    uVar15 = (ulong)((char)local_c8._target == '-');
    bVar28 = *(byte *)((long)&local_c8._target + uVar15);
    if ((bVar28 == 0x30) || (*(char *)((long)&local_c8._target + uVar15 + 1) != '.')) {
      __assert_fail("mantissa[0] != \'0\' && mantissa[1] == \'.\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x203d,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    pbVar25 = (byte *)((long)&local_c8._target + uVar15 + 1);
    *pbVar25 = bVar28;
    goto LAB_00126fad;
  case '\x19':
    local_c8._target = (xpath_allocator *)(c->n)._node._root;
    local_c8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar23 = (char *)local_name((xpath_node *)&local_c8);
    goto LAB_00126f18;
  case '\x1a':
    local_c8._target = stack->result;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_60 = (undefined1  [16])
               xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),local_98,
                           local_a8._0_4_);
    pcVar27 = local_name((xpath_node *)local_60);
    goto LAB_00126e7a;
  case '\x1b':
    local_c8._target = (xpath_allocator *)(c->n)._node._root;
    local_c8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar23 = (char *)namespace_uri((xpath_node *)&local_c8);
    goto LAB_00126f18;
  case '\x1c':
    local_c8._target = stack->result;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_60 = (undefined1  [16])
               xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),local_98,
                           local_a8._0_4_);
    pcVar27 = namespace_uri((xpath_node *)local_60);
    goto LAB_00126e7a;
  case '\x1d':
    pxVar10 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar10 != (xml_node_struct *)0x0) ||
       (pxVar10 = (c->n)._node._root, pxVar10 != (xml_node_struct *)0x0)) {
      pcVar23 = (char *)"";
      if (pxVar10->name != (char_t *)0x0) {
        pcVar23 = (char *)pxVar10->name;
      }
      goto LAB_00126f18;
    }
    break;
  case '\x1e':
    local_c8._target = stack->result;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    xVar40 = xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),local_98,local_a8._0_4_)
    ;
    xVar22._attr = xVar40._attribute._attr._attr;
    if ((xVar40._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar22._attr = (xml_attribute_struct *)xVar40._node._root._root,
       xVar40._node._root._root == (xml_node_struct *)0x0)) goto LAB_00126e73;
    pcVar27 = "";
    if (((xml_node_struct *)xVar22._attr)->name != (char_t *)0x0) {
      pcVar27 = ((xml_node_struct *)xVar22._attr)->name;
    }
    goto LAB_00126e7a;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    return __return_storage_ptr__;
  case ' ':
    goto switchD_001263e6_caseD_20;
  case '!':
    local_c8._target = stack->temp;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    lVar20 = 1;
    for (pxVar11 = this->_right; pxVar11 != (xpath_ast_node *)0x0; pxVar11 = pxVar11->_next) {
      lVar20 = lVar20 + 1;
    }
    pxVar12 = (xpath_allocator *)xpath_allocator::allocate(local_c8._target,lVar20 * 0x18);
    if (pxVar12 != (xpath_allocator *)0x0) {
      local_60._8_8_ = (xml_attribute_struct *)stack->result;
      local_60._0_8_ = (xml_node_struct *)stack->temp;
      eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_60);
      pxVar12->_error = (bool *)local_98;
      pxVar12->_root = (xpath_memory_block *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      pxVar12->_root_size = CONCAT71(local_a8._9_7_,local_a8[8]);
      pxVar11 = this->_right;
      local_88 = pxVar12;
      local_48 = stack;
      if (pxVar11 == (xpath_ast_node *)0x0) {
        lVar32 = 1;
        local_80 = (anon_union_8_5_7bd254c6_for__data *)__return_storage_ptr__;
      }
      else {
        lVar32 = 1;
        local_80 = (anon_union_8_5_7bd254c6_for__data *)__return_storage_ptr__;
        do {
          eval_string((xpath_string *)local_a8,pxVar11,c,(xpath_stack *)local_60);
          pxVar12[1]._error = (bool *)local_98;
          pxVar12[1]._root = (xpath_memory_block *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
          pxVar12[1]._root_size = CONCAT71(local_a8._9_7_,local_a8[8]);
          lVar32 = lVar32 + 1;
          pxVar11 = pxVar11->_next;
          pxVar12 = pxVar12 + 1;
        } while (pxVar11 != (xpath_ast_node *)0x0);
      }
      pxVar7 = local_48;
      if (lVar32 != lVar20) {
        __assert_fail("pos == count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2959,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                     );
      }
      if (lVar20 == 0) {
        pbVar33 = (bool *)0x1;
      }
      else {
        ppbVar24 = &local_88->_error;
        pbVar33 = (bool *)0x0;
        lVar32 = lVar20;
        do {
          if ((char)ppbVar24[-1] == '\x01') {
            pbVar16 = *ppbVar24;
          }
          else {
            pbVar16 = (bool *)strlength((char_t *)((xpath_allocator *)(ppbVar24 + -2))->_root);
          }
          pbVar33 = pbVar33 + (long)pbVar16;
          ppbVar24 = ppbVar24 + 3;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
        pbVar33 = pbVar33 + 1;
      }
      pxVar17 = (xpath_allocator *)xpath_allocator::allocate(pxVar7->result,(size_t)pbVar33);
      __return_storage_ptr__ = (xpath_string *)local_80;
      if (pxVar17 == (xpath_allocator *)0x0) goto LAB_00126e73;
      pxVar12 = pxVar17;
      if (lVar20 != 0) {
        lVar32 = 0;
        do {
          pxVar4 = local_88[lVar32]._root;
          cVar2 = *(char_t *)&pxVar4->next;
          while (cVar2 != '\0') {
            pxVar4 = (xpath_memory_block *)((long)&pxVar4->next + 1);
            *(char_t *)&pxVar12->_root = cVar2;
            pxVar12 = (xpath_allocator *)((long)&pxVar12->_root + 1);
            cVar2 = *(char_t *)pxVar4;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != lVar20);
      }
      *(char_t *)&pxVar12->_root = '\0';
      goto LAB_00126e6c;
    }
LAB_00126e73:
    pcVar27 = "";
LAB_00126e7a:
    __return_storage_ptr__->_buffer = pcVar27;
LAB_00126ec7:
    *(bool *)((long)__return_storage_ptr__ + 8) = false;
    ((anon_union_8_5_7bd254c6_for__data *)((long)__return_storage_ptr__ + 0x10))->string =
         (char_t *)0x0;
    goto LAB_00126ed4;
  case '$':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_78._8_8_ = (xml_attribute_struct *)stack->result;
    local_78._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_78);
    eval_string((xpath_string *)local_60,this->_right,c,(xpath_stack *)local_78);
    pcVar27 = (char_t *)
              strstr((char *)CONCAT44(local_a8._4_4_,local_a8._0_4_),(char *)local_60._0_8_);
    if (pcVar27 == (char_t *)0x0) goto LAB_00126e73;
    xpath_string::from_heap
              (__return_storage_ptr__,(char_t *)CONCAT44(local_a8._4_4_,local_a8._0_4_),pcVar27,
               stack->result);
    goto LAB_00126ed4;
  case '%':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_78._8_8_ = (xml_attribute_struct *)stack->result;
    local_78._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_78);
    eval_string((xpath_string *)local_60,this->_right,c,(xpath_stack *)local_78);
    uVar6 = local_60._0_8_;
    pcVar23 = strstr((char *)CONCAT44(local_a8._4_4_,local_a8._0_4_),(char *)local_60._0_8_);
    if (pcVar23 == (char *)0x0) {
      pcVar27 = "";
    }
    else {
      if (local_60[8] != true) {
        local_50 = strlength((char_t *)uVar6);
      }
      if (local_a8[8] != true) {
        local_98 = (xpath_node *)strlength((char_t *)CONCAT44(local_a8._4_4_,local_a8._0_4_));
      }
      pcVar27 = (char_t *)(pcVar23 + local_50);
      if (local_a8[8] == true) {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar27,
                   (char_t *)CONCAT44(local_a8._4_4_,local_a8._0_4_) + (long)local_98,stack->result)
        ;
        goto LAB_00126ed4;
      }
    }
    __return_storage_ptr__->_buffer = pcVar27;
    goto LAB_00126ec7;
  case '&':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_60._8_8_ = (xml_attribute_struct *)stack->result;
    local_60._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_60);
    pxVar13 = local_98;
    if (local_a8[8] != true) {
      pxVar13 = (xpath_node *)strlength((char_t *)CONCAT44(local_a8._4_4_,local_a8._0_4_));
    }
    dVar34 = eval_number(this->_right,c,stack);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar34 + 0.5;
    auVar37 = vroundsd_avx(auVar37,auVar37,9);
    local_78._0_8_ = auVar37._0_8_;
    pcVar27 = "";
    puVar29 = (undefined1 *)((long)&(pxVar13->_node)._root + 1);
    auVar39 = vcvtusi2sd_avx512f(auVar39,puVar29);
    if ((double)auVar37._0_8_ < auVar39._0_8_) {
      auVar39 = vmaxsd_avx(ZEXT816(0x3ff0000000000000),auVar37);
      lVar20 = vcvttsd2usi_avx512f(auVar39);
      if (puVar29 <= (undefined1 *)(lVar20 - 1U)) {
        __assert_fail("1 <= pos && pos <= s_length + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x29e0,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      pcVar21 = (char_t *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      if (local_a8[8] != true) {
        local_98 = (xpath_node *)strlength(pcVar21);
      }
      pcVar27 = pcVar21 + lVar20 + -1;
      if (local_a8[8] != true) goto LAB_00126ec4;
      xpath_string::from_heap(__return_storage_ptr__,pcVar27,pcVar21 + (long)local_98,stack->result)
      ;
      goto LAB_00126ed4;
    }
    goto LAB_00126ec4;
  case '\'':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_60._8_8_ = (xml_attribute_struct *)stack->result;
    local_60._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_60);
    pxVar13 = local_98;
    if (local_a8[8] != true) {
      pxVar13 = (xpath_node *)strlength((char_t *)CONCAT44(local_a8._4_4_,local_a8._0_4_));
    }
    local_88 = (xpath_allocator *)eval_number(this->_right,c,stack);
    dVar34 = eval_number(this->_right->_next,c,stack);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (double)local_88 + 0.5;
    auVar39 = vroundsd_avx(auVar39,auVar39,9);
    xVar38._root = auVar39._0_8_;
    local_78._0_8_ = xVar38._root;
    pcVar27 = "";
    if (!NAN((double)xVar38._root) && !NAN((double)xVar38._root)) {
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar34 + 0.5;
      auVar35 = vroundsd_avx(auVar35,auVar35,9);
      local_78._0_8_ = (double)xVar38._root + auVar35._0_8_;
      if (!NAN((double)local_78._0_8_) && !NAN((double)local_78._0_8_)) {
        puVar29 = (undefined1 *)((long)&(pxVar13->_node)._root + 1);
        auVar37 = vcvtusi2sd_avx512f(auVar37,puVar29);
        if ((((double)xVar38._root < auVar37._0_8_) &&
            ((double)xVar38._root < (double)local_78._0_8_)) && (1.0 <= (double)local_78._0_8_)) {
          auVar39 = vmaxsd_avx(ZEXT816(0x3ff0000000000000),auVar39);
          lVar20 = vcvttsd2usi_avx512f(auVar39);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_78._0_8_;
          puVar14 = (undefined1 *)vcvttsd2usi_avx512f(auVar36);
          if (auVar37._0_8_ <= (double)local_78._0_8_) {
            puVar14 = puVar29;
          }
          if ((puVar14 <= (undefined1 *)(lVar20 - 1U)) || (puVar29 < puVar14)) {
            __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x29fc,
                          "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                         );
          }
          pcVar27 = (char_t *)(CONCAT44(local_a8._4_4_,local_a8._0_4_) + -1 + lVar20);
          if ((puVar14 != puVar29) || (local_a8[8] == true)) {
            xpath_string::from_heap
                      (__return_storage_ptr__,pcVar27,
                       puVar14 + CONCAT44(local_a8._4_4_,local_a8._0_4_) + -1,stack->result);
            goto LAB_00126ed4;
          }
        }
      }
    }
LAB_00126ec4:
    __return_storage_ptr__->_buffer = pcVar27;
    goto LAB_00126ec7;
  case '*':
    string_value((xpath_string *)&local_c8,&c->n,stack->result);
    goto LAB_0012676b;
  case '+':
    eval_string((xpath_string *)&local_c8,this->_left,c,stack);
LAB_0012676b:
    pbVar18 = xpath_string::data((xpath_string *)&local_c8,stack->result);
    if (pbVar18 != (byte *)0x0) {
      pbVar30 = normalize_space(pbVar18);
      goto LAB_00126934;
    }
    break;
  case ',':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_40.temp = stack->result;
    local_40.result = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,stack);
    eval_string((xpath_string *)local_60,this->_right,c,&local_40);
    eval_string((xpath_string *)local_78,this->_right->_next,c,&local_40);
    pxVar12 = (xpath_allocator *)xpath_string::data((xpath_string *)local_a8,stack->result);
    if (pxVar12 == (xpath_allocator *)0x0) goto LAB_00126e73;
    __s = local_60._0_8_;
    uVar6 = local_78._0_8_;
    local_80 = (anon_union_8_5_7bd254c6_for__data *)__return_storage_ptr__;
    if (local_78[8] != true) {
      local_68 = strlength((char_t *)local_78._0_8_);
    }
    bVar28 = *(byte *)&pxVar12->_root;
    pxVar17 = pxVar12;
    local_88 = pxVar12;
    if (bVar28 != 0) goto LAB_00126d59;
    goto LAB_00126d88;
  case ':':
    eval_string((xpath_string *)&local_c8,this->_left,c,stack);
    pbVar18 = xpath_string::data((xpath_string *)&local_c8,stack->result);
    if (pbVar18 != (byte *)0x0) {
      bVar28 = *pbVar18;
      pbVar30 = pbVar18;
      if (bVar28 != 0) {
        pcVar27 = (this->_data).string;
        pbVar25 = pbVar18;
        do {
          pbVar25 = pbVar25 + 1;
          if ((char)bVar28 < '\0') {
            *pbVar30 = bVar28;
            pbVar30 = pbVar30 + 1;
          }
          else {
            bVar28 = pcVar27[bVar28];
            *pbVar30 = bVar28;
            pbVar30 = pbVar30 + (-1 < (char)bVar28);
          }
          bVar28 = *pbVar25;
        } while (bVar28 != 0);
      }
      *pbVar30 = 0;
      goto LAB_00126934;
    }
  }
  pcVar23 = (char *)"";
  goto LAB_00126f18;
LAB_00126d59:
  pxVar17 = (xpath_allocator *)((long)&pxVar17->_root + 1);
  pcVar23 = strchr((char *)__s,(uint)bVar28);
  if (pcVar23 == (char *)0x0) {
LAB_00126d76:
    *(byte *)&pxVar12->_root = bVar28;
    pxVar12 = (xpath_allocator *)((long)&pxVar12->_root + 1);
  }
  else {
    uVar15 = (long)pcVar23 - __s;
    if (uVar15 < local_68) {
      bVar28 = *(byte *)(uVar6 + uVar15);
      goto LAB_00126d76;
    }
  }
  bVar28 = *(byte *)&pxVar17->_root;
  if (bVar28 == 0) {
LAB_00126d88:
    *(char_t *)&pxVar12->_root = '\0';
    pxVar17 = local_88;
LAB_00126e6c:
    __return_storage_ptr__ = (xpath_string *)local_80;
    xpath_string::from_heap_preallocated
              ((xpath_string *)local_80,(char_t *)pxVar17,(char_t *)pxVar12);
LAB_00126ed4:
    xpath_allocator_capture::~xpath_allocator_capture(&local_c8);
    return __return_storage_ptr__;
  }
  goto LAB_00126d59;
switchD_001263e6_caseD_20:
  this = this->_left;
  goto LAB_001263ce;
switchD_001263e6_caseD_12:
  pcVar23 = (char *)this->_data;
  goto LAB_00126f18;
  while (pbVar31 = pbVar18 + -1, pbVar30 = pbVar18, pbVar18 = pbVar18 + -1, *pbVar31 == 0x30) {
LAB_00126fad:
    pbVar30 = pbVar25;
    if (pbVar18 == pbVar25) break;
  }
  uVar26 = iVar9 + 1;
  *pbVar30 = 0;
  sVar19 = strlen((char *)&local_c8);
  uVar5 = -uVar26;
  if (0 < (int)uVar26) {
    uVar5 = uVar26;
  }
  size = (ulong)uVar5 + 4 + sVar19;
  pbVar18 = (byte *)xpath_allocator::allocate(pxVar12,size);
  if (pbVar18 != (byte *)0x0) {
    pbVar30 = pbVar18;
    if ((double)local_88 < 0.0) {
      pbVar30 = pbVar18 + 1;
      *pbVar18 = 0x2d;
    }
    if (iVar9 < 0) {
      *pbVar30 = 0x30;
      pbVar30 = pbVar30 + 1;
    }
    else {
      iVar9 = iVar9 + 2;
      do {
        bVar28 = *pbVar25;
        if (9 < bVar28 - 0x30 && bVar28 != 0) {
          __assert_fail("*mantissa == 0 || static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x206e,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        bVar8 = bVar28 != 0;
        if (!bVar8) {
          bVar28 = 0x30;
        }
        pbVar25 = pbVar25 + bVar8;
        *pbVar30 = bVar28;
        pbVar30 = pbVar30 + 1;
        iVar9 = iVar9 + -1;
      } while (1 < iVar9);
      uVar26 = 0;
    }
    if (*pbVar25 != 0) {
      *pbVar30 = 0x2e;
      pbVar31 = pbVar30 + 1;
      if ((int)uVar26 < 0) {
        memset(pbVar31,0x30,(ulong)-uVar26);
        pbVar31 = pbVar30 + (1 - uVar26);
      }
      bVar28 = *pbVar25;
      pbVar30 = pbVar31;
      while (bVar28 != 0) {
        pbVar25 = pbVar25 + 1;
        if (9 < bVar28 - 0x30) {
          __assert_fail("static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x2084,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        *pbVar30 = bVar28;
        pbVar30 = pbVar30 + 1;
        bVar28 = *pbVar25;
      }
    }
    if (pbVar18 + size <= pbVar30) {
      __assert_fail("s < result + result_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x208a,
                    "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                   );
    }
    *pbVar30 = 0;
    __return_storage_ptr__ = (xpath_string *)local_80;
LAB_00126934:
    xpath_string::from_heap_preallocated(__return_storage_ptr__,pbVar18,pbVar30);
    return __return_storage_ptr__;
  }
  pcVar23 = "";
  __return_storage_ptr__ = (xpath_string *)local_80;
LAB_00126f18:
  *(char **)__return_storage_ptr__ = pcVar23;
LAB_00126f1b:
  *(bool *)((long)__return_storage_ptr__ + 8) = false;
  ((anon_union_8_5_7bd254c6_for__data *)((long)__return_storage_ptr__ + 0x10))->string =
       (char_t *)0x0;
  return (xpath_string *)(anon_union_8_5_7bd254c6_for__data *)__return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= s_length + 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= s_length + 1) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= s_length + 1 ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

				case xpath_type_number:
					return convert_number_to_string(eval_number(c, stack), stack.result);

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.temp);

					xpath_stack swapped_stack = {stack.temp, stack.result};

					xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
					return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
				}

				default:
					assert(false && "Wrong expression for return type string"); // unreachable
					return xpath_string();
				}
			}
			}
		}